

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool __thiscall
EthBasePort::WriteQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar flags)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  undefined6 in_register_00000032;
  EthBasePort *this_00;
  uchar *puVar5;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT62(in_register_00000032,node) == 0x3f) {
    bVar4 = 0;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"WriteQuadlet","");
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
    bVar4 = (byte)iVar3 ^ 1;
  }
  if ((node != 0x3f) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar4 == 0) {
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar5 = (this->super_BasePort).GenericBuffer;
    uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
    puVar5 = puVar5 + uVar2;
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    (*(this->super_BasePort)._vptr_BasePort[0x31])(this,puVar5,(ulong)(iVar3 + 0x14U),node,flags);
    uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,0);
    puVar5[uVar2] = '\0';
    if (((flags & 0x40) != 0) || (this->useFwBridge == false)) {
      puVar5[uVar2] = '\x01';
    }
    puVar5[uVar2 + 1] = (uchar)(this->super_BasePort).FwBusGeneration;
    this_00 = this;
    uVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_qwrite_packet(this_00,(quadlet_t *)(puVar5 + uVar2),node,addr,data,(uint)this->fw_tl);
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,node,puVar5,(ulong)(iVar3 + 0x14U),(ulong)(flags >> 7));
    uVar1 = (undefined1)iVar3;
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool EthBasePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteQuadlet"))
        return false;

    // Use GenericBuffer, which is much larger than needed
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    unsigned int packetSize = GetPrefixOffset(WR_FW_HEADER)+FW_QWRITE_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet (also byteswaps data)
    make_qwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, data, fw_tl);

    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}